

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabSet.cpp
# Opt level: O1

FabSet * __thiscall
amrex::FabSet::linComb(FabSet *this,Real a,Real b,FabSet *src,int scomp,int dcomp,int ncomp)

{
  ulong uVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  Array4<double> dstfab;
  Array4<const_double> srcfab;
  FabSetIter fsi;
  long local_178;
  long local_170;
  Box local_12c;
  Array4<double> local_110;
  Array4<const_double> local_d0;
  MFIter local_90;
  
  MFIter::MFIter(&local_90,(FabArrayBase *)this,'\0');
  if (local_90.currentIndex < local_90.endIndex) {
    do {
      BATransformer::operator()
                (&local_12c,&((local_90.fabArray)->boxarray).m_bat,
                 (Box *)((long)((local_90.index_map)->super_vector<int,_std::allocator<int>_>).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[local_90.currentIndex] * 0x1c +
                        *(long *)&((((local_90.fabArray)->boxarray).m_ref.
                                    super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr)->m_abox).
                                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                  _M_impl.super__Vector_impl_data));
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_d0,(FabArray<amrex::FArrayBox> *)src,&local_90);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_110,(FabArray<amrex::FArrayBox> *)this,&local_90);
      if (0 < ncomp) {
        lVar7 = (long)local_12c.smallend.vect[1];
        uVar1 = 0;
        local_178 = (long)scomp << 3;
        local_170 = (long)dcomp << 3;
        do {
          iVar2 = local_12c.smallend.vect[2];
          if (local_12c.smallend.vect[2] <= local_12c.bigend.vect[2]) {
            do {
              if (local_12c.smallend.vect[1] <= local_12c.bigend.vect[1]) {
                lVar5 = (long)local_d0.p +
                        local_d0.nstride * local_178 +
                        (lVar7 - local_d0.begin.y) * local_d0.jstride * 8 +
                        ((long)iVar2 - (long)local_d0.begin.z) * local_d0.kstride * 8 +
                        (long)local_d0.begin.x * -8 + (long)local_12c.smallend.vect[0] * 8;
                lVar3 = (long)local_110.p +
                        local_110.nstride * local_170 +
                        (lVar7 - local_110.begin.y) * local_110.jstride * 8 +
                        ((long)iVar2 - (long)local_110.begin.z) * local_110.kstride * 8 +
                        (long)local_110.begin.x * -8 + (long)local_12c.smallend.vect[0] * 8;
                lVar4 = lVar7;
                do {
                  if (local_12c.smallend.vect[0] <= local_12c.bigend.vect[0]) {
                    lVar6 = 0;
                    do {
                      *(double *)(lVar3 + lVar6 * 8) =
                           *(double *)(lVar3 + lVar6 * 8) * a + *(double *)(lVar5 + lVar6 * 8) * b;
                      lVar6 = lVar6 + 1;
                    } while ((local_12c.bigend.vect[0] - local_12c.smallend.vect[0]) + 1 !=
                             (int)lVar6);
                  }
                  lVar4 = lVar4 + 1;
                  lVar5 = lVar5 + local_d0.jstride * 8;
                  lVar3 = lVar3 + local_110.jstride * 8;
                } while (local_12c.bigend.vect[1] + 1 != (int)lVar4);
              }
              bVar8 = iVar2 != local_12c.bigend.vect[2];
              iVar2 = iVar2 + 1;
            } while (bVar8);
          }
          uVar1 = uVar1 + 1;
          local_178 = local_178 + 8;
          local_170 = local_170 + 8;
        } while (uVar1 != (uint)ncomp);
      }
      MFIter::operator++(&local_90);
    } while (local_90.currentIndex < local_90.endIndex);
  }
  MFIter::~MFIter(&local_90);
  return this;
}

Assistant:

FabSet&
FabSet::linComb (Real a, Real b, const FabSet& src, int scomp, int dcomp, int ncomp)
{
    BL_ASSERT(size() == src.size());

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (FabSetIter fsi(*this); fsi.isValid(); ++fsi)
    {
        const Box& bx = fsi.validbox();
        auto const srcfab =   src.array(fsi);
        auto       dstfab = this->array(fsi);
        AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
        {
            dstfab(i,j,k,n+dcomp) = a*dstfab(i,j,k,n+dcomp) + b*srcfab(i,j,k,n+scomp);
        });
    }
    return *this;
}